

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_set_charset(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vmobjfile_ext_t *pvVar3;
  vm_val_t *in_RDX;
  CVmObjFile *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vm_val_t *in_stack_ffffffffffffffc8;
  CVmObjFile *pCVar4;
  
  pCVar4 = in_RDI;
  if ((getp_set_charset(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_set_charset(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_set_charset::desc,1);
    __cxa_guard_release(&getp_set_charset(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    vVar2 = get_charset_arg((int)((ulong)pCVar4 >> 0x20),(int)pCVar4);
    pvVar3 = get_ext(in_RDI);
    pvVar3->charset = vVar2;
    CVmStack::discard();
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_set_charset(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve and save the character set argument */
    get_ext()->charset = get_charset_arg(vmg_ 0, 1);

    /* discard arguments */
    G_stk->discard();

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}